

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

int flatcc_builder_start_vector
              (flatcc_builder_t *B,size_t elem_size,uint16_t align,size_t max_count)

{
  int iVar1;
  uint16_t align_00;
  
  align_00 = 4;
  if (4 < align) {
    align_00 = align;
  }
  iVar1 = enter_frame(B,align_00);
  if (iVar1 == 0) {
    (B->frame->container).table.vs_end = (flatbuffers_uoffset_t)elem_size;
    (B->frame->container).table.pl_end = 0;
    (B->frame->container).table.vt_hash = (uint32_t)max_count;
    B->frame->type = 4;
    refresh_ds(B,0xfffffffc);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int flatcc_builder_start_vector(flatcc_builder_t *B, size_t elem_size, uint16_t align, size_t max_count)
{
    get_min_align(&align, field_size);
    if (enter_frame(B, align)) {
        return -1;
    }
    frame(container.vector.elem_size) = (uoffset_t)elem_size;
    frame(container.vector.count) = 0;
    frame(container.vector.max_count) = (uoffset_t)max_count;
    frame(type) = flatcc_builder_vector;
    refresh_ds(B, data_limit);
    return 0;
}